

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

void __thiscall
kratos::ModportPort::ModportPort(ModportPort *this,InterfaceRef *ref,Var *var,PortDirection dir)

{
  int iVar1;
  uint32_t width;
  undefined4 extraout_var;
  
  iVar1 = (*(var->super_IRNode)._vptr_IRNode[0xd])(var);
  width = (*(var->super_IRNode)._vptr_IRNode[7])(var);
  Port::Port((Port *)this,(Generator *)CONCAT44(extraout_var,iVar1),dir,&var->name,width,&var->size_
             ,Data,var->is_signed_);
  (this->super_InterfacePort).interface_ = ref;
  (this->super_InterfacePort).super_Port.super_Var.super_IRNode._vptr_IRNode =
       (_func_int **)&PTR_accept_002b3858;
  this->var_ = var;
  (this->super_InterfacePort).super_Port.super_Var.explicit_array_ = var->explicit_array_;
  return;
}

Assistant:

ModportPort::ModportPort(InterfaceRef* ref, kratos::Var* var, kratos::PortDirection dir)
    : InterfacePort(ref, var->generator(), dir, var->name, var->width(), var->size(),
                    PortType::Data, var->is_signed()),
      var_(var) {
    explicit_array_ = var->explicit_array();
}